

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetectorOutput.h
# Opt level: O0

void DetectorOutput::callback(Race *race,void *context)

{
  uintptr_t uVar1;
  uintptr_t uVar2;
  const_reference pvVar3;
  ostream *poVar4;
  char *pcVar5;
  void *context_local;
  Race *race_local;
  
  uVar1 = callback::s1;
  pvVar3 = std::array<unsigned_long,_16UL>::operator[](&(race->first).stack_trace,0);
  uVar2 = callback::s2;
  if (uVar1 != *pvVar3) {
    pvVar3 = std::array<unsigned_long,_16UL>::operator[](&(race->second).stack_trace,0);
    if (uVar2 != *pvVar3) {
      pvVar3 = std::array<unsigned_long,_16UL>::operator[](&(race->first).stack_trace,0);
      callback::s1 = *pvVar3;
      pvVar3 = std::array<unsigned_long,_16UL>::operator[](&(race->second).stack_trace,0);
      callback::s2 = *pvVar3;
      poVar4 = std::operator<<((ostream *)&std::cout,"pc:   ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(void *)callback::s1);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(void *)callback::s2);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(poVar4,"addr: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(void *)(race->first).accessed_memory);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(poVar4,"rw:   ");
      pcVar5 = "read";
      if (((race->first).write & 1U) != 0) {
        pcVar5 = "write";
      }
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4," ");
      pcVar5 = "read";
      if (((race->second).write & 1U) != 0) {
        pcVar5 = "write";
      }
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(poVar4,"tid:  ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(race->first).thread_id);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(race->second).thread_id);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"race: ");
      callback::i = callback::i + 1;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,callback::i);
      std::operator<<(poVar4,"\n");
    }
  }
  return;
}

Assistant:

static void callback(const Detector::Race* race, void* context) {
    static uintptr_t s1 = 0, s2 = 0;
    if (s1 != race->first.stack_trace[0] && s2 != race->second.stack_trace[0]) {
      static int i = 0;
      s1 = race->first.stack_trace[0];
      s2 = race->second.stack_trace[0];
      std::cout << "pc:   " << (void*)(s1) << " " << (void*)(s2) << std::endl
                << "addr: " << (void*)(race->first.accessed_memory) << std::endl
                << "rw:   " << (race->first.write ? "write" : "read") << " "
                << (race->second.write ? "write" : "read") << std::endl
                << "tid:  " << std::hex << race->first.thread_id << " "
                << std::hex << race->second.thread_id << std::endl;
      std::cout << "race: " << ++i << "\n";
    }
  }